

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O3

PrimInfo * __thiscall
embree::sse2::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::sse2::CurveGeometryInterface,_embree::BezierCurveT>
::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)2,_embree::sse2::CurveGeometryInterface,_embree::BezierCurveT>
          *this,PrimRef *prims,range<unsigned_long> *r,size_t k,uint geomID)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  BufferView<embree::Vec3fx> *pBVar6;
  BufferView<embree::Vec3fa> *pBVar7;
  char *pcVar8;
  size_t sVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  long lVar13;
  undefined4 uVar14;
  long lVar15;
  bool bVar16;
  ulong uVar17;
  int unaff_EBP;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  bool bVar24;
  float fVar25;
  float fVar52;
  float fVar53;
  float fVar54;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar51;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar80;
  float fVar81;
  float fVar97;
  float fVar98;
  Vec3fa n1;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar99;
  float fVar110;
  float fVar111;
  Vec3fa n0;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar112;
  float fVar121;
  float fVar122;
  float fVar123;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  vfloat4 a;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar134;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  float fVar141;
  float fVar146;
  float fVar150;
  vfloat4 a_1;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar151;
  float fVar152;
  float fVar153;
  undefined1 auVar145 [16];
  float fVar154;
  float fVar155;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  uint uVar171;
  uint uVar172;
  uint uVar173;
  uint uVar174;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  float fVar178;
  float fVar183;
  float fVar184;
  Vec3ff v3;
  float fVar185;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  uint uVar189;
  float fVar191;
  uint uVar192;
  float fVar193;
  uint uVar194;
  float fVar195;
  uint uVar196;
  undefined1 auVar190 [16];
  float fVar197;
  float fVar198;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  size_t local_d0;
  size_t local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar20 = r->_begin;
  if (uVar20 < r->_end) {
    local_d0 = 0;
    local_b8 = _DAT_01f7a9f0;
    local_a8 = _DAT_01f7aa00;
    local_88 = _DAT_01f7a9f0;
    local_98 = _DAT_01f7aa00;
    local_c0 = k;
    do {
      pBVar6 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
               vertices.items;
      uVar171 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::BezierCurveT>).
                                    super_CurveGeometry.super_Geometry.field_0x58 +
                         *(long *)&(this->super_CurveGeometryInterface<embree::BezierCurveT>).
                                   super_CurveGeometry.field_0x68 * uVar20);
      uVar17 = (ulong)uVar171;
      uVar21 = (ulong)(uVar171 + 3);
      if (uVar21 < (pBVar6->super_RawBufferView).num) {
        uVar22 = (ulong)(uVar171 + 1);
        uVar23 = (ulong)(uVar171 + 2);
        pBVar7 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
                 normals.items;
        fVar81 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
                 maxRadiusScale;
        uVar19 = 0;
        do {
          pcVar8 = pBVar6[uVar19].super_RawBufferView.ptr_ofs;
          sVar9 = pBVar6[uVar19].super_RawBufferView.stride;
          lVar15 = sVar9 * uVar17;
          lVar13 = sVar9 * uVar22;
          auVar124._4_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar8 + lVar13 + 0xc)));
          auVar124._0_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar8 + lVar15 + 0xc)));
          auVar124._8_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar8 + sVar9 * uVar23 + 0xc)));
          auVar124._12_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar8 + sVar9 * uVar21 + 0xc)));
          unaff_EBP = movmskps(unaff_EBP,auVar124);
          if (unaff_EBP != 0) goto LAB_00996008;
          auVar124 = *(undefined1 (*) [16])(pcVar8 + lVar15);
          fVar55 = auVar124._0_4_;
          fVar74 = auVar124._4_4_;
          fVar76 = auVar124._8_4_;
          fVar78 = auVar124._12_4_;
          auVar156._0_4_ = -(uint)(fVar55 < 1.844e+18 && -1.844e+18 < fVar55);
          auVar156._4_4_ = -(uint)(fVar74 < 1.844e+18 && -1.844e+18 < fVar74);
          auVar156._8_4_ = -(uint)(fVar76 < 1.844e+18 && -1.844e+18 < fVar76);
          auVar156._12_4_ = -(uint)(fVar78 < 1.844e+18 && -1.844e+18 < fVar78);
          uVar14 = movmskps((int)lVar15,auVar156);
          if ((~(byte)uVar14 & 7) != 0) goto LAB_00996008;
          auVar124 = *(undefined1 (*) [16])(pcVar8 + lVar13);
          fVar25 = auVar124._0_4_;
          fVar52 = auVar124._4_4_;
          fVar53 = auVar124._8_4_;
          fVar54 = auVar124._12_4_;
          auVar165._0_4_ = -(uint)(fVar25 < 1.844e+18 && -1.844e+18 < fVar25);
          auVar165._4_4_ = -(uint)(fVar52 < 1.844e+18 && -1.844e+18 < fVar52);
          auVar165._8_4_ = -(uint)(fVar53 < 1.844e+18 && -1.844e+18 < fVar53);
          auVar165._12_4_ = -(uint)(fVar54 < 1.844e+18 && -1.844e+18 < fVar54);
          uVar14 = movmskps((int)lVar13,auVar165);
          if ((~(byte)uVar14 & 7) != 0) goto LAB_00996008;
          auVar124 = *(undefined1 (*) [16])(pcVar8 + sVar9 * uVar23);
          fVar112 = auVar124._0_4_;
          fVar121 = auVar124._4_4_;
          fVar122 = auVar124._8_4_;
          fVar123 = auVar124._12_4_;
          auVar175._0_4_ = -(uint)(fVar112 < 1.844e+18 && -1.844e+18 < fVar112);
          auVar175._4_4_ = -(uint)(fVar121 < 1.844e+18 && -1.844e+18 < fVar121);
          auVar175._8_4_ = -(uint)(fVar122 < 1.844e+18 && -1.844e+18 < fVar122);
          auVar175._12_4_ = -(uint)(fVar123 < 1.844e+18 && -1.844e+18 < fVar123);
          uVar14 = movmskps(CONCAT31((int3)((uint)uVar14 >> 8),~(byte)uVar14),auVar175);
          if ((~(byte)uVar14 & 7) != 0) goto LAB_00996008;
          auVar124 = *(undefined1 (*) [16])(pcVar8 + sVar9 * uVar21);
          fVar178 = auVar124._0_4_;
          fVar183 = auVar124._4_4_;
          fVar184 = auVar124._8_4_;
          fVar185 = auVar124._12_4_;
          auVar179._0_4_ = -(uint)(fVar178 < 1.844e+18 && -1.844e+18 < fVar178);
          auVar179._4_4_ = -(uint)(fVar183 < 1.844e+18 && -1.844e+18 < fVar183);
          auVar179._8_4_ = -(uint)(fVar184 < 1.844e+18 && -1.844e+18 < fVar184);
          auVar179._12_4_ = -(uint)(fVar185 < 1.844e+18 && -1.844e+18 < fVar185);
          uVar14 = movmskps(CONCAT31((int3)((uint)uVar14 >> 8),~(byte)uVar14),auVar179);
          if ((~(byte)uVar14 & 7) != 0) goto LAB_00996008;
          pcVar8 = pBVar7[uVar19].super_RawBufferView.ptr_ofs;
          sVar9 = pBVar7[uVar19].super_RawBufferView.stride;
          auVar124 = *(undefined1 (*) [16])(pcVar8 + sVar9 * uVar17);
          fVar99 = auVar124._0_4_;
          fVar110 = auVar124._4_4_;
          fVar111 = auVar124._8_4_;
          auVar186._0_4_ = -(uint)(fVar99 < 1.844e+18 && -1.844e+18 < fVar99);
          auVar186._4_4_ = -(uint)(fVar110 < 1.844e+18 && -1.844e+18 < fVar110);
          auVar186._8_4_ = -(uint)(fVar111 < 1.844e+18 && -1.844e+18 < fVar111);
          auVar186._12_4_ = -(uint)(auVar124._12_4_ < 1.844e+18 && -1.844e+18 < auVar124._12_4_);
          uVar14 = movmskps((int)(sVar9 * uVar17),auVar186);
          if ((~(byte)uVar14 & 7) != 0) goto LAB_00996008;
          auVar124 = *(undefined1 (*) [16])(pcVar8 + sVar9 * uVar22);
          fVar80 = auVar124._0_4_;
          fVar97 = auVar124._4_4_;
          fVar98 = auVar124._8_4_;
          auVar113._0_4_ = -(uint)(fVar80 < 1.844e+18 && -1.844e+18 < fVar80);
          auVar113._4_4_ = -(uint)(fVar97 < 1.844e+18 && -1.844e+18 < fVar97);
          auVar113._8_4_ = -(uint)(fVar98 < 1.844e+18 && -1.844e+18 < fVar98);
          auVar113._12_4_ = -(uint)(auVar124._12_4_ < 1.844e+18 && -1.844e+18 < auVar124._12_4_);
          uVar14 = movmskps((int)(sVar9 * uVar22),auVar113);
          if ((~(byte)uVar14 & 7) != 0) goto LAB_00996008;
          fVar78 = fVar78 * fVar81;
          fVar185 = fVar185 * fVar81;
          pfVar1 = (float *)(pcVar8 + sVar9 * uVar23);
          pfVar2 = (float *)(pcVar8 + sVar9 * uVar21);
          fVar143 = *pfVar2;
          fVar144 = pfVar2[1];
          fVar149 = pfVar2[2];
          fVar195 = fVar123 * fVar81 * 0.0;
          fVar141 = fVar178 * 0.0 + fVar112 * 0.0;
          fVar146 = fVar183 * 0.0 + fVar121 * 0.0;
          fVar150 = fVar184 * 0.0 + fVar122 * 0.0;
          fVar153 = fVar185 * 0.0 + fVar195;
          fVar154 = fVar25 * 0.0;
          fVar160 = fVar52 * 0.0;
          fVar162 = fVar53 * 0.0;
          fVar164 = fVar54 * fVar81 * 0.0;
          fVar197 = fVar154 + fVar141 + fVar55;
          fVar203 = fVar160 + fVar146 + fVar74;
          fVar205 = fVar162 + fVar150 + fVar76;
          fVar207 = fVar164 + fVar153 + fVar78;
          fVar25 = (fVar25 * 3.0 + fVar141) - fVar55 * 3.0;
          fVar52 = (fVar52 * 3.0 + fVar146) - fVar74 * 3.0;
          fVar53 = (fVar53 * 3.0 + fVar150) - fVar76 * 3.0;
          fVar54 = (fVar54 * fVar81 * 3.0 + fVar153) - fVar78 * 3.0;
          fVar141 = *pfVar1 * 0.0;
          fVar146 = pfVar1[1] * 0.0;
          fVar150 = pfVar1[2] * 0.0;
          fVar155 = fVar143 * 0.0 + fVar141;
          fVar161 = fVar144 * 0.0 + fVar146;
          fVar163 = fVar149 * 0.0 + fVar150;
          fVar153 = fVar80 * 0.0;
          fVar147 = fVar97 * 0.0;
          fVar151 = fVar98 * 0.0;
          fVar142 = fVar153 + fVar155 + fVar99;
          fVar148 = fVar147 + fVar161 + fVar110;
          fVar152 = fVar151 + fVar163 + fVar111;
          fVar80 = (fVar80 * 3.0 + fVar155) - fVar99 * 3.0;
          fVar97 = (fVar97 * 3.0 + fVar161) - fVar110 * 3.0;
          fVar98 = (fVar98 * 3.0 + fVar163) - fVar111 * 3.0;
          fVar163 = fVar112 * 0.0 + fVar178 + fVar154 + fVar55 * 0.0;
          fVar191 = fVar121 * 0.0 + fVar183 + fVar160 + fVar74 * 0.0;
          fVar193 = fVar122 * 0.0 + fVar184 + fVar162 + fVar76 * 0.0;
          fVar195 = fVar195 + fVar185 + fVar164 + fVar78 * 0.0;
          fVar154 = ((fVar178 * 3.0 - fVar112 * 3.0) + fVar154) - fVar55 * 0.0;
          fVar155 = ((fVar183 * 3.0 - fVar121 * 3.0) + fVar160) - fVar74 * 0.0;
          fVar160 = ((fVar184 * 3.0 - fVar122 * 3.0) + fVar162) - fVar76 * 0.0;
          fVar161 = ((fVar185 * 3.0 - fVar123 * fVar81 * 3.0) + fVar164) - fVar78 * 0.0;
          fVar74 = fVar141 + fVar143 + fVar153 + fVar99 * 0.0;
          fVar78 = fVar146 + fVar144 + fVar147 + fVar110 * 0.0;
          fVar112 = fVar150 + fVar149 + fVar151 + fVar111 * 0.0;
          fVar122 = ((fVar143 * 3.0 - *pfVar1 * 3.0) + fVar153) - fVar99 * 0.0;
          fVar121 = ((fVar144 * 3.0 - pfVar1[1] * 3.0) + fVar147) - fVar110 * 0.0;
          fVar178 = ((fVar149 * 3.0 - pfVar1[2] * 3.0) + fVar151) - fVar111 * 0.0;
          fVar143 = fVar142 * fVar52 - fVar148 * fVar25;
          fVar149 = fVar148 * fVar53 - fVar152 * fVar52;
          fVar141 = fVar152 * fVar25 - fVar142 * fVar53;
          fVar55 = fVar52 * fVar80 - fVar97 * fVar25;
          fVar76 = fVar53 * fVar97 - fVar98 * fVar52;
          fVar123 = fVar25 * fVar98 - fVar80 * fVar53;
          fVar185 = fVar74 * fVar155 - fVar78 * fVar154;
          fVar184 = fVar78 * fVar160 - fVar112 * fVar155;
          fVar110 = fVar112 * fVar154 - fVar74 * fVar160;
          fVar78 = fVar155 * fVar122 - fVar121 * fVar154;
          fVar121 = fVar160 * fVar121 - fVar178 * fVar155;
          fVar122 = fVar154 * fVar178 - fVar122 * fVar160;
          fVar146 = fVar141 * fVar141 + fVar149 * fVar149 + fVar143 * fVar143;
          auVar156 = ZEXT416((uint)fVar146);
          auVar124 = rsqrtss(ZEXT416((uint)fVar146),auVar156);
          fVar74 = auVar124._0_4_;
          fVar144 = fVar74 * 1.5 - fVar74 * fVar74 * fVar146 * 0.5 * fVar74;
          fVar153 = fVar143 * fVar55 + fVar141 * fVar123 + fVar149 * fVar76;
          auVar124 = rcpss(auVar156,auVar156);
          fVar74 = (2.0 - fVar146 * auVar124._0_4_) * auVar124._0_4_;
          fVar80 = fVar110 * fVar110 + fVar184 * fVar184 + fVar185 * fVar185;
          auVar124 = ZEXT416((uint)fVar80);
          auVar156 = rsqrtss(ZEXT416((uint)fVar80),auVar124);
          fVar112 = auVar156._0_4_;
          fVar178 = fVar112 * 1.5 - fVar112 * fVar112 * fVar80 * 0.5 * fVar112;
          fVar150 = fVar185 * fVar78 + fVar110 * fVar122 + fVar184 * fVar121;
          auVar124 = rcpss(auVar124,auVar124);
          fVar112 = (2.0 - fVar80 * auVar124._0_4_) * auVar124._0_4_;
          fVar183 = fVar207 * fVar149 * fVar144;
          fVar99 = fVar207 * fVar141 * fVar144;
          fVar111 = fVar207 * fVar143 * fVar144;
          fVar142 = fVar197 - fVar183;
          fVar147 = fVar203 - fVar99;
          fVar148 = fVar205 - fVar111;
          fVar97 = fVar207 * fVar74 * (fVar146 * fVar76 - fVar153 * fVar149) * fVar144 +
                   fVar54 * fVar149 * fVar144;
          fVar98 = fVar207 * fVar74 * (fVar146 * fVar123 - fVar153 * fVar141) * fVar144 +
                   fVar54 * fVar141 * fVar144;
          fVar143 = fVar207 * fVar74 * (fVar146 * fVar55 - fVar153 * fVar143) * fVar144 +
                    fVar54 * fVar143 * fVar144;
          fVar55 = fVar195 * fVar184 * fVar178;
          fVar74 = fVar195 * fVar110 * fVar178;
          fVar76 = fVar195 * fVar185 * fVar178;
          fVar144 = fVar163 - fVar55;
          fVar149 = fVar191 - fVar74;
          fVar141 = fVar193 - fVar76;
          fVar121 = fVar195 * fVar112 * (fVar80 * fVar121 - fVar150 * fVar184) * fVar178 +
                    fVar161 * fVar184 * fVar178;
          fVar122 = fVar195 * fVar112 * (fVar80 * fVar122 - fVar150 * fVar110) * fVar178 +
                    fVar161 * fVar110 * fVar178;
          fVar123 = fVar195 * fVar112 * (fVar80 * fVar78 - fVar150 * fVar185) * fVar178 +
                    fVar161 * fVar185 * fVar178;
          fVar185 = (fVar25 - fVar97) * 0.33333334 + fVar142;
          fVar178 = (fVar52 - fVar98) * 0.33333334 + fVar147;
          fVar184 = (fVar53 - fVar143) * 0.33333334 + fVar148;
          fVar78 = fVar144 - (fVar154 - fVar121) * 0.33333334;
          fVar54 = fVar149 - (fVar155 - fVar122) * 0.33333334;
          fVar112 = fVar141 - (fVar160 - fVar123) * 0.33333334;
          lVar13 = 0;
          auVar124 = _DAT_01f7aa00;
          auVar156 = _DAT_01f7aa00;
          auVar165 = _DAT_01f7aa00;
          auVar175 = _DAT_01f7a9f0;
          auVar179 = _DAT_01f7a9f0;
          auVar186 = _DAT_01f7a9f0;
          bVar24 = true;
          do {
            bVar16 = bVar24;
            iVar18 = (int)lVar13;
            lVar15 = lVar13 * 4;
            fVar110 = *(float *)(bezier_basis0 + lVar15 + 0x1dc);
            fVar80 = *(float *)(bezier_basis0 + lVar15 + 0x1e0);
            fVar146 = *(float *)(bezier_basis0 + lVar15 + 0x1e4);
            fVar150 = *(float *)(bezier_basis0 + lVar15 + 0x1e8);
            lVar15 = lVar13 * 4;
            fVar153 = *(float *)(bezier_basis0 + lVar15 + 0x660);
            fVar151 = *(float *)(bezier_basis0 + lVar15 + 0x664);
            fVar152 = *(float *)(bezier_basis0 + lVar15 + 0x668);
            fVar161 = *(float *)(bezier_basis0 + lVar15 + 0x66c);
            lVar15 = lVar13 * 4;
            fVar162 = *(float *)(bezier_basis0 + lVar15 + 0xae4);
            fVar164 = *(float *)(bezier_basis0 + lVar15 + 0xae8);
            fVar195 = *(float *)(bezier_basis0 + lVar15 + 0xaec);
            fVar207 = *(float *)(bezier_basis0 + lVar15 + 0xaf0);
            lVar15 = lVar13 * 4;
            fVar10 = *(float *)(bezier_basis0 + lVar15 + 0xf68);
            fVar11 = *(float *)(bezier_basis0 + lVar15 + 0xf6c);
            fVar12 = *(float *)(bezier_basis0 + lVar15 + 0xf70);
            fVar57 = *(float *)(bezier_basis0 + lVar15 + 0xf74);
            auVar125._0_4_ =
                 fVar142 * fVar110 + fVar185 * fVar153 + fVar78 * fVar162 + fVar144 * fVar10;
            auVar125._4_4_ =
                 fVar142 * fVar80 + fVar185 * fVar151 + fVar78 * fVar164 + fVar144 * fVar11;
            auVar125._8_4_ =
                 fVar142 * fVar146 + fVar185 * fVar152 + fVar78 * fVar195 + fVar144 * fVar12;
            auVar125._12_4_ =
                 fVar142 * fVar150 + fVar185 * fVar161 + fVar78 * fVar207 + fVar144 * fVar57;
            auVar145._0_4_ =
                 fVar147 * fVar110 + fVar178 * fVar153 + fVar54 * fVar162 + fVar149 * fVar10;
            auVar145._4_4_ =
                 fVar147 * fVar80 + fVar178 * fVar151 + fVar54 * fVar164 + fVar149 * fVar11;
            auVar145._8_4_ =
                 fVar147 * fVar146 + fVar178 * fVar152 + fVar54 * fVar195 + fVar149 * fVar12;
            auVar145._12_4_ =
                 fVar147 * fVar150 + fVar178 * fVar161 + fVar54 * fVar207 + fVar149 * fVar57;
            auVar135._0_4_ =
                 fVar110 * fVar148 + fVar153 * fVar184 + fVar162 * fVar112 + fVar10 * fVar141;
            auVar135._4_4_ =
                 fVar80 * fVar148 + fVar151 * fVar184 + fVar164 * fVar112 + fVar11 * fVar141;
            auVar135._8_4_ =
                 fVar146 * fVar148 + fVar152 * fVar184 + fVar195 * fVar112 + fVar12 * fVar141;
            auVar135._12_4_ =
                 fVar150 * fVar148 + fVar161 * fVar184 + fVar207 * fVar112 + fVar57 * fVar141;
            lVar15 = lVar13 * 4;
            fVar110 = *(float *)(bezier_basis0 + lVar15 + 0x13ec);
            fVar80 = *(float *)(bezier_basis0 + lVar15 + 0x13f0);
            fVar146 = *(float *)(bezier_basis0 + lVar15 + 0x13f4);
            fVar150 = *(float *)(bezier_basis0 + lVar15 + 0x13f8);
            lVar15 = lVar13 * 4;
            fVar153 = *(float *)(bezier_basis0 + lVar15 + 0x1cf4);
            fVar151 = *(float *)(bezier_basis0 + lVar15 + 0x1cf8);
            fVar152 = *(float *)(bezier_basis0 + lVar15 + 0x1cfc);
            fVar161 = *(float *)(bezier_basis0 + lVar15 + 0x1d00);
            lVar15 = lVar13 * 4;
            fVar162 = *(float *)(bezier_basis0 + lVar15 + 0x2178);
            fVar164 = *(float *)(bezier_basis0 + lVar15 + 0x217c);
            fVar195 = *(float *)(bezier_basis0 + lVar15 + 0x2180);
            fVar207 = *(float *)(bezier_basis0 + lVar15 + 0x2184);
            lVar13 = lVar13 * 4;
            fVar10 = *(float *)(bezier_basis0 + lVar13 + 0x1870);
            fVar11 = *(float *)(bezier_basis0 + lVar13 + 0x1874);
            fVar12 = *(float *)(bezier_basis0 + lVar13 + 0x1878);
            fVar57 = *(float *)(bezier_basis0 + lVar13 + 0x187c);
            fVar198 = fVar142 * fVar110 + fVar185 * fVar10 + fVar78 * fVar153 + fVar144 * fVar162;
            fVar204 = fVar142 * fVar80 + fVar185 * fVar11 + fVar78 * fVar151 + fVar144 * fVar164;
            fVar206 = fVar142 * fVar146 + fVar185 * fVar12 + fVar78 * fVar152 + fVar144 * fVar195;
            fVar208 = fVar142 * fVar150 + fVar185 * fVar57 + fVar78 * fVar161 + fVar144 * fVar207;
            fVar56 = fVar147 * fVar110 + fVar178 * fVar10 + fVar54 * fVar153 + fVar149 * fVar162;
            fVar75 = fVar147 * fVar80 + fVar178 * fVar11 + fVar54 * fVar151 + fVar149 * fVar164;
            fVar77 = fVar147 * fVar146 + fVar178 * fVar12 + fVar54 * fVar152 + fVar149 * fVar195;
            fVar79 = fVar147 * fVar150 + fVar178 * fVar57 + fVar54 * fVar161 + fVar149 * fVar207;
            fVar110 = fVar110 * fVar148 + fVar10 * fVar184 + fVar153 * fVar112 + fVar162 * fVar141;
            fVar80 = fVar80 * fVar148 + fVar11 * fVar184 + fVar151 * fVar112 + fVar164 * fVar141;
            fVar146 = fVar146 * fVar148 + fVar12 * fVar184 + fVar152 * fVar112 + fVar195 * fVar141;
            fVar150 = fVar150 * fVar148 + fVar57 * fVar184 + fVar161 * fVar112 + fVar207 * fVar141;
            uVar171 = -(uint)(iVar18 == 0);
            uVar172 = -(uint)(iVar18 == 1);
            uVar173 = -(uint)(iVar18 == 2);
            uVar174 = -(uint)(iVar18 == 3);
            uVar189 = -(uint)(iVar18 == 7);
            uVar192 = -(uint)(iVar18 == 6);
            uVar194 = -(uint)(iVar18 == 5);
            uVar196 = -(uint)(iVar18 == 4);
            auVar100._0_4_ = (float)(~uVar189 & (uint)fVar198) * 0.055555556 + auVar125._0_4_;
            auVar100._4_4_ = (float)(~uVar192 & (uint)fVar204) * 0.055555556 + auVar125._4_4_;
            auVar100._8_4_ = (float)(~uVar194 & (uint)fVar206) * 0.055555556 + auVar125._8_4_;
            auVar100._12_4_ = (float)(~uVar196 & (uint)fVar208) * 0.055555556 + auVar125._12_4_;
            auVar186 = minps(auVar186,auVar125);
            auVar113 = maxps(auVar124,auVar125);
            auVar102._0_8_ =
                 CONCAT44(auVar125._4_4_ - (float)(~uVar172 & (uint)fVar204) * 0.055555556,
                          auVar125._0_4_ - (float)(~uVar171 & (uint)fVar198) * 0.055555556);
            auVar102._8_4_ = auVar125._8_4_ - (float)(~uVar173 & (uint)fVar206) * 0.055555556;
            auVar102._12_4_ = auVar125._12_4_ - (float)(~uVar174 & (uint)fVar208) * 0.055555556;
            auVar126._0_4_ = (float)(~uVar189 & (uint)fVar56) * 0.055555556 + auVar145._0_4_;
            auVar126._4_4_ = (float)(~uVar192 & (uint)fVar75) * 0.055555556 + auVar145._4_4_;
            auVar126._8_4_ = (float)(~uVar194 & (uint)fVar77) * 0.055555556 + auVar145._8_4_;
            auVar126._12_4_ = (float)(~uVar196 & (uint)fVar79) * 0.055555556 + auVar145._12_4_;
            auVar175 = minps(auVar175,auVar145);
            auVar165 = maxps(auVar165,auVar145);
            auVar82._0_8_ =
                 CONCAT44(auVar145._4_4_ - (float)(~uVar172 & (uint)fVar75) * 0.055555556,
                          auVar145._0_4_ - (float)(~uVar171 & (uint)fVar56) * 0.055555556);
            auVar82._8_4_ = auVar145._8_4_ - (float)(~uVar173 & (uint)fVar77) * 0.055555556;
            auVar82._12_4_ = auVar145._12_4_ - (float)(~uVar174 & (uint)fVar79) * 0.055555556;
            auVar190._0_4_ = (float)(~uVar189 & (uint)fVar110) * 0.055555556 + auVar135._0_4_;
            auVar190._4_4_ = (float)(~uVar192 & (uint)fVar80) * 0.055555556 + auVar135._4_4_;
            auVar190._8_4_ = (float)(~uVar194 & (uint)fVar146) * 0.055555556 + auVar135._8_4_;
            auVar190._12_4_ = (float)(~uVar196 & (uint)fVar150) * 0.055555556 + auVar135._12_4_;
            auVar179 = minps(auVar179,auVar135);
            auVar145 = maxps(auVar156,auVar135);
            auVar136._0_8_ =
                 CONCAT44(auVar135._4_4_ - (float)(~uVar172 & (uint)fVar80) * 0.055555556,
                          auVar135._0_4_ - (float)(~uVar171 & (uint)fVar110) * 0.055555556);
            auVar136._8_4_ = auVar135._8_4_ - (float)(~uVar173 & (uint)fVar146) * 0.055555556;
            auVar136._12_4_ = auVar135._12_4_ - (float)(~uVar174 & (uint)fVar150) * 0.055555556;
            auVar114._8_4_ = auVar102._8_4_;
            auVar114._0_8_ = auVar102._0_8_;
            auVar114._12_4_ = auVar102._12_4_;
            auVar124 = minps(auVar114,auVar100);
            auVar186 = minps(auVar186,auVar124);
            auVar58._8_4_ = auVar82._8_4_;
            auVar58._0_8_ = auVar82._0_8_;
            auVar58._12_4_ = auVar82._12_4_;
            auVar124 = minps(auVar58,auVar126);
            auVar175 = minps(auVar175,auVar124);
            auVar59._8_4_ = auVar136._8_4_;
            auVar59._0_8_ = auVar136._0_8_;
            auVar59._12_4_ = auVar136._12_4_;
            auVar124 = minps(auVar59,auVar190);
            auVar179 = minps(auVar179,auVar124);
            auVar124 = maxps(auVar102,auVar100);
            auVar124 = maxps(auVar113,auVar124);
            auVar156 = maxps(auVar82,auVar126);
            auVar165 = maxps(auVar165,auVar156);
            auVar156 = maxps(auVar136,auVar190);
            auVar156 = maxps(auVar145,auVar156);
            lVar13 = 4;
            bVar24 = false;
          } while (bVar16);
          fVar197 = fVar197 + fVar183;
          fVar203 = fVar203 + fVar99;
          fVar205 = fVar205 + fVar111;
          fVar163 = fVar163 + fVar55;
          fVar191 = fVar191 + fVar74;
          fVar193 = fVar193 + fVar76;
          fVar55 = (fVar97 + fVar25) * 0.33333334 + fVar197;
          fVar74 = (fVar98 + fVar52) * 0.33333334 + fVar203;
          fVar76 = (fVar143 + fVar53) * 0.33333334 + fVar205;
          fVar78 = fVar163 - (fVar121 + fVar154) * 0.33333334;
          fVar25 = fVar191 - (fVar122 + fVar155) * 0.33333334;
          fVar52 = fVar193 - (fVar123 + fVar160) * 0.33333334;
          auVar26._4_4_ = auVar186._0_4_;
          auVar26._0_4_ = auVar186._4_4_;
          auVar26._8_4_ = auVar186._12_4_;
          auVar26._12_4_ = auVar186._8_4_;
          auVar186 = minps(auVar26,auVar186);
          auVar60._0_8_ = auVar186._8_8_;
          auVar60._8_4_ = auVar186._0_4_;
          auVar60._12_4_ = auVar186._4_4_;
          auVar186 = minps(auVar60,auVar186);
          auVar27._4_4_ = auVar175._0_4_;
          auVar27._0_4_ = auVar175._4_4_;
          auVar27._8_4_ = auVar175._12_4_;
          auVar27._12_4_ = auVar175._8_4_;
          auVar175 = minps(auVar27,auVar175);
          auVar101._0_8_ = auVar175._8_8_;
          auVar101._8_4_ = auVar175._0_4_;
          auVar101._12_4_ = auVar175._4_4_;
          auVar175 = minps(auVar101,auVar175);
          auVar28._4_4_ = auVar179._0_4_;
          auVar28._0_4_ = auVar179._4_4_;
          auVar28._8_4_ = auVar179._12_4_;
          auVar28._12_4_ = auVar179._8_4_;
          auVar179 = minps(auVar28,auVar179);
          auVar29._0_8_ = auVar179._8_8_;
          auVar29._8_4_ = auVar179._0_4_;
          auVar29._12_4_ = auVar179._4_4_;
          auVar138._4_4_ = auVar175._0_4_;
          auVar138._0_4_ = auVar186._0_4_;
          auVar30._4_4_ = auVar124._0_4_;
          auVar30._0_4_ = auVar124._4_4_;
          auVar30._8_4_ = auVar124._12_4_;
          auVar30._12_4_ = auVar124._8_4_;
          auVar124 = maxps(auVar30,auVar124);
          auVar61._0_8_ = auVar124._8_8_;
          auVar61._8_4_ = auVar124._0_4_;
          auVar61._12_4_ = auVar124._4_4_;
          auVar175 = maxps(auVar61,auVar124);
          auVar31._4_4_ = auVar165._0_4_;
          auVar31._0_4_ = auVar165._4_4_;
          auVar31._8_4_ = auVar165._12_4_;
          auVar31._12_4_ = auVar165._8_4_;
          auVar124 = maxps(auVar31,auVar165);
          auVar83._0_8_ = auVar124._8_8_;
          auVar83._8_4_ = auVar124._0_4_;
          auVar83._12_4_ = auVar124._4_4_;
          auVar124 = maxps(auVar83,auVar124);
          auVar32._4_4_ = auVar156._0_4_;
          auVar32._0_4_ = auVar156._4_4_;
          auVar32._8_4_ = auVar156._12_4_;
          auVar32._12_4_ = auVar156._8_4_;
          auVar186 = maxps(auVar32,auVar156);
          auVar33._0_8_ = auVar186._8_8_;
          auVar33._8_4_ = auVar186._0_4_;
          auVar33._12_4_ = auVar186._4_4_;
          auVar168._4_4_ = auVar124._0_4_;
          auVar168._0_4_ = auVar175._0_4_;
          lVar13 = 0;
          local_228 = _DAT_01f7aa00;
          local_218 = _DAT_01f7aa00;
          auVar124 = _DAT_01f7a9f0;
          auVar156 = _DAT_01f7aa00;
          auVar165 = _DAT_01f7a9f0;
          auVar175 = _DAT_01f7a9f0;
          bVar24 = true;
          do {
            bVar16 = bVar24;
            iVar18 = (int)lVar13;
            lVar15 = lVar13 * 4;
            fVar53 = *(float *)(bezier_basis0 + lVar15 + 0x1dc);
            fVar54 = *(float *)(bezier_basis0 + lVar15 + 0x1e0);
            fVar112 = *(float *)(bezier_basis0 + lVar15 + 0x1e4);
            fVar121 = *(float *)(bezier_basis0 + lVar15 + 0x1e8);
            lVar15 = lVar13 * 4;
            fVar122 = *(float *)(bezier_basis0 + lVar15 + 0x660);
            fVar123 = *(float *)(bezier_basis0 + lVar15 + 0x664);
            fVar185 = *(float *)(bezier_basis0 + lVar15 + 0x668);
            fVar178 = *(float *)(bezier_basis0 + lVar15 + 0x66c);
            lVar15 = lVar13 * 4;
            fVar183 = *(float *)(bezier_basis0 + lVar15 + 0xae4);
            fVar184 = *(float *)(bezier_basis0 + lVar15 + 0xae8);
            fVar99 = *(float *)(bezier_basis0 + lVar15 + 0xaec);
            fVar110 = *(float *)(bezier_basis0 + lVar15 + 0xaf0);
            lVar15 = lVar13 * 4;
            fVar111 = *(float *)(bezier_basis0 + lVar15 + 0xf68);
            fVar80 = *(float *)(bezier_basis0 + lVar15 + 0xf6c);
            fVar97 = *(float *)(bezier_basis0 + lVar15 + 0xf70);
            fVar98 = *(float *)(bezier_basis0 + lVar15 + 0xf74);
            auVar127._0_4_ =
                 fVar197 * fVar53 + fVar55 * fVar122 + fVar78 * fVar183 + fVar163 * fVar111;
            auVar127._4_4_ =
                 fVar197 * fVar54 + fVar55 * fVar123 + fVar78 * fVar184 + fVar163 * fVar80;
            auVar127._8_4_ =
                 fVar197 * fVar112 + fVar55 * fVar185 + fVar78 * fVar99 + fVar163 * fVar97;
            auVar127._12_4_ =
                 fVar197 * fVar121 + fVar55 * fVar178 + fVar78 * fVar110 + fVar163 * fVar98;
            auVar166._0_4_ =
                 fVar203 * fVar53 + fVar74 * fVar122 + fVar25 * fVar183 + fVar191 * fVar111;
            auVar166._4_4_ =
                 fVar203 * fVar54 + fVar74 * fVar123 + fVar25 * fVar184 + fVar191 * fVar80;
            auVar166._8_4_ =
                 fVar203 * fVar112 + fVar74 * fVar185 + fVar25 * fVar99 + fVar191 * fVar97;
            auVar166._12_4_ =
                 fVar203 * fVar121 + fVar74 * fVar178 + fVar25 * fVar110 + fVar191 * fVar98;
            auVar199._0_4_ =
                 fVar53 * fVar205 + fVar122 * fVar76 + fVar183 * fVar52 + fVar111 * fVar193;
            auVar199._4_4_ =
                 fVar54 * fVar205 + fVar123 * fVar76 + fVar184 * fVar52 + fVar80 * fVar193;
            auVar199._8_4_ =
                 fVar112 * fVar205 + fVar185 * fVar76 + fVar99 * fVar52 + fVar97 * fVar193;
            auVar199._12_4_ =
                 fVar121 * fVar205 + fVar178 * fVar76 + fVar110 * fVar52 + fVar98 * fVar193;
            lVar15 = lVar13 * 4;
            fVar53 = *(float *)(bezier_basis0 + lVar15 + 0x13ec);
            fVar54 = *(float *)(bezier_basis0 + lVar15 + 0x13f0);
            fVar112 = *(float *)(bezier_basis0 + lVar15 + 0x13f4);
            fVar121 = *(float *)(bezier_basis0 + lVar15 + 0x13f8);
            lVar15 = lVar13 * 4;
            fVar122 = *(float *)(bezier_basis0 + lVar15 + 0x1cf4);
            fVar123 = *(float *)(bezier_basis0 + lVar15 + 0x1cf8);
            fVar185 = *(float *)(bezier_basis0 + lVar15 + 0x1cfc);
            fVar178 = *(float *)(bezier_basis0 + lVar15 + 0x1d00);
            lVar15 = lVar13 * 4;
            fVar183 = *(float *)(bezier_basis0 + lVar15 + 0x2178);
            fVar184 = *(float *)(bezier_basis0 + lVar15 + 0x217c);
            fVar99 = *(float *)(bezier_basis0 + lVar15 + 0x2180);
            fVar110 = *(float *)(bezier_basis0 + lVar15 + 0x2184);
            lVar13 = lVar13 * 4;
            fVar111 = *(float *)(bezier_basis0 + lVar13 + 0x1870);
            fVar80 = *(float *)(bezier_basis0 + lVar13 + 0x1874);
            fVar97 = *(float *)(bezier_basis0 + lVar13 + 0x1878);
            fVar98 = *(float *)(bezier_basis0 + lVar13 + 0x187c);
            fVar146 = fVar197 * fVar53 + fVar55 * fVar111 + fVar78 * fVar122 + fVar163 * fVar183;
            fVar150 = fVar197 * fVar54 + fVar55 * fVar80 + fVar78 * fVar123 + fVar163 * fVar184;
            fVar153 = fVar197 * fVar112 + fVar55 * fVar97 + fVar78 * fVar185 + fVar163 * fVar99;
            fVar142 = fVar197 * fVar121 + fVar55 * fVar98 + fVar78 * fVar178 + fVar163 * fVar110;
            fVar143 = fVar203 * fVar53 + fVar74 * fVar111 + fVar25 * fVar122 + fVar191 * fVar183;
            fVar144 = fVar203 * fVar54 + fVar74 * fVar80 + fVar25 * fVar123 + fVar191 * fVar184;
            fVar149 = fVar203 * fVar112 + fVar74 * fVar97 + fVar25 * fVar185 + fVar191 * fVar99;
            fVar141 = fVar203 * fVar121 + fVar74 * fVar98 + fVar25 * fVar178 + fVar191 * fVar110;
            fVar53 = fVar53 * fVar205 + fVar111 * fVar76 + fVar122 * fVar52 + fVar183 * fVar193;
            fVar54 = fVar54 * fVar205 + fVar80 * fVar76 + fVar123 * fVar52 + fVar184 * fVar193;
            fVar112 = fVar112 * fVar205 + fVar97 * fVar76 + fVar185 * fVar52 + fVar99 * fVar193;
            fVar121 = fVar121 * fVar205 + fVar98 * fVar76 + fVar178 * fVar52 + fVar110 * fVar193;
            uVar189 = -(uint)(iVar18 == 0);
            uVar192 = -(uint)(iVar18 == 1);
            uVar194 = -(uint)(iVar18 == 2);
            uVar196 = -(uint)(iVar18 == 3);
            uVar171 = -(uint)(iVar18 == 7);
            uVar172 = -(uint)(iVar18 == 6);
            uVar173 = -(uint)(iVar18 == 5);
            uVar174 = -(uint)(iVar18 == 4);
            auVar176._0_4_ = (float)(~uVar171 & (uint)fVar146) * 0.055555556 + auVar127._0_4_;
            auVar176._4_4_ = (float)(~uVar172 & (uint)fVar150) * 0.055555556 + auVar127._4_4_;
            auVar176._8_4_ = (float)(~uVar173 & (uint)fVar153) * 0.055555556 + auVar127._8_4_;
            auVar176._12_4_ = (float)(~uVar174 & (uint)fVar142) * 0.055555556 + auVar127._12_4_;
            auVar175 = minps(auVar175,auVar127);
            auVar114 = maxps(auVar156,auVar127);
            auVar157._0_8_ =
                 CONCAT44(auVar127._4_4_ - (float)(~uVar192 & (uint)fVar150) * 0.055555556,
                          auVar127._0_4_ - (float)(~uVar189 & (uint)fVar146) * 0.055555556);
            auVar157._8_4_ = auVar127._8_4_ - (float)(~uVar194 & (uint)fVar153) * 0.055555556;
            auVar157._12_4_ = auVar127._12_4_ - (float)(~uVar196 & (uint)fVar142) * 0.055555556;
            auVar128._0_4_ = (float)(~uVar171 & (uint)fVar143) * 0.055555556 + auVar166._0_4_;
            auVar128._4_4_ = (float)(~uVar172 & (uint)fVar144) * 0.055555556 + auVar166._4_4_;
            auVar128._8_4_ = (float)(~uVar173 & (uint)fVar149) * 0.055555556 + auVar166._8_4_;
            auVar128._12_4_ = (float)(~uVar174 & (uint)fVar141) * 0.055555556 + auVar166._12_4_;
            auVar165 = minps(auVar165,auVar166);
            auVar102 = maxps(local_218,auVar166);
            auVar167._0_8_ =
                 CONCAT44(auVar166._4_4_ - (float)(~uVar192 & (uint)fVar144) * 0.055555556,
                          auVar166._0_4_ - (float)(~uVar189 & (uint)fVar143) * 0.055555556);
            auVar167._8_4_ = auVar166._8_4_ - (float)(~uVar194 & (uint)fVar149) * 0.055555556;
            auVar167._12_4_ = auVar166._12_4_ - (float)(~uVar196 & (uint)fVar141) * 0.055555556;
            auVar137._0_4_ = (float)(~uVar171 & (uint)fVar53) * 0.055555556 + auVar199._0_4_;
            auVar137._4_4_ = (float)(~uVar172 & (uint)fVar54) * 0.055555556 + auVar199._4_4_;
            auVar137._8_4_ = (float)(~uVar173 & (uint)fVar112) * 0.055555556 + auVar199._8_4_;
            auVar137._12_4_ = (float)(~uVar174 & (uint)fVar121) * 0.055555556 + auVar199._12_4_;
            auVar124 = minps(auVar124,auVar199);
            auVar113 = maxps(local_228,auVar199);
            auVar200._0_8_ =
                 CONCAT44(auVar199._4_4_ - (float)(~uVar192 & (uint)fVar54) * 0.055555556,
                          auVar199._0_4_ - (float)(~uVar189 & (uint)fVar53) * 0.055555556);
            auVar200._8_4_ = auVar199._8_4_ - (float)(~uVar194 & (uint)fVar112) * 0.055555556;
            auVar200._12_4_ = auVar199._12_4_ - (float)(~uVar196 & (uint)fVar121) * 0.055555556;
            auVar84._8_4_ = auVar157._8_4_;
            auVar84._0_8_ = auVar157._0_8_;
            auVar84._12_4_ = auVar157._12_4_;
            auVar156 = minps(auVar84,auVar176);
            auVar175 = minps(auVar175,auVar156);
            auVar85._8_4_ = auVar167._8_4_;
            auVar85._0_8_ = auVar167._0_8_;
            auVar85._12_4_ = auVar167._12_4_;
            auVar156 = minps(auVar85,auVar128);
            auVar165 = minps(auVar165,auVar156);
            auVar86._8_4_ = auVar200._8_4_;
            auVar86._0_8_ = auVar200._0_8_;
            auVar86._12_4_ = auVar200._12_4_;
            auVar156 = minps(auVar86,auVar137);
            auVar124 = minps(auVar124,auVar156);
            auVar156 = maxps(auVar157,auVar176);
            auVar156 = maxps(auVar114,auVar156);
            auVar114 = maxps(auVar167,auVar128);
            local_218 = maxps(auVar102,auVar114);
            auVar102 = maxps(auVar200,auVar137);
            local_228 = maxps(auVar113,auVar102);
            lVar13 = 4;
            bVar24 = false;
          } while (bVar16);
          auVar179 = minps(auVar29,auVar179);
          auVar138._8_4_ = auVar179._0_4_;
          auVar138._12_4_ = 0;
          auVar179 = maxps(auVar33,auVar186);
          auVar168._8_4_ = auVar179._0_4_;
          auVar168._12_4_ = 0;
          auVar87._4_4_ = auVar175._0_4_;
          auVar87._0_4_ = auVar175._4_4_;
          auVar87._8_4_ = auVar175._12_4_;
          auVar87._12_4_ = auVar175._8_4_;
          auVar175 = minps(auVar87,auVar175);
          auVar103._0_8_ = auVar175._8_8_;
          auVar103._8_4_ = auVar175._0_4_;
          auVar103._12_4_ = auVar175._4_4_;
          auVar175 = minps(auVar103,auVar175);
          auVar88._4_4_ = auVar165._0_4_;
          auVar88._0_4_ = auVar165._4_4_;
          auVar88._8_4_ = auVar165._12_4_;
          auVar88._12_4_ = auVar165._8_4_;
          auVar165 = minps(auVar88,auVar165);
          auVar129._0_8_ = auVar165._8_8_;
          auVar129._8_4_ = auVar165._0_4_;
          auVar129._12_4_ = auVar165._4_4_;
          auVar165 = minps(auVar129,auVar165);
          auVar89._4_4_ = auVar124._0_4_;
          auVar89._0_4_ = auVar124._4_4_;
          auVar89._8_4_ = auVar124._12_4_;
          auVar89._12_4_ = auVar124._8_4_;
          auVar124 = minps(auVar89,auVar124);
          auVar62._0_8_ = auVar124._8_8_;
          auVar62._8_4_ = auVar124._0_4_;
          auVar62._12_4_ = auVar124._4_4_;
          auVar124 = minps(auVar62,auVar124);
          auVar130._4_4_ = auVar165._0_4_;
          auVar130._0_4_ = auVar175._0_4_;
          auVar130._8_4_ = auVar124._0_4_;
          auVar130._12_4_ = 0;
          auVar175 = minps(auVar138,auVar130);
          auVar63._4_4_ = auVar156._0_4_;
          auVar63._0_4_ = auVar156._4_4_;
          auVar63._8_4_ = auVar156._12_4_;
          auVar63._12_4_ = auVar156._8_4_;
          auVar124 = maxps(auVar63,auVar156);
          auVar90._0_8_ = auVar124._8_8_;
          auVar90._8_4_ = auVar124._0_4_;
          auVar90._12_4_ = auVar124._4_4_;
          auVar165 = maxps(auVar90,auVar124);
          auVar64._4_4_ = local_218._0_4_;
          auVar64._0_4_ = local_218._4_4_;
          auVar64._8_4_ = local_218._12_4_;
          auVar64._12_4_ = local_218._8_4_;
          auVar124 = maxps(auVar64,local_218);
          auVar34._0_8_ = auVar124._8_8_;
          auVar34._8_4_ = auVar124._0_4_;
          auVar34._12_4_ = auVar124._4_4_;
          auVar124 = maxps(auVar34,auVar124);
          auVar65._4_4_ = local_228._0_4_;
          auVar65._0_4_ = local_228._4_4_;
          auVar65._8_4_ = local_228._12_4_;
          auVar65._12_4_ = local_228._8_4_;
          auVar156 = maxps(auVar65,local_228);
          auVar91._0_8_ = auVar156._8_8_;
          auVar91._8_4_ = auVar156._0_4_;
          auVar91._12_4_ = auVar156._4_4_;
          auVar156 = maxps(auVar91,auVar156);
          auVar35._4_4_ = auVar124._0_4_;
          auVar35._0_4_ = auVar165._0_4_;
          auVar35._8_4_ = auVar156._0_4_;
          auVar35._12_4_ = 0;
          auVar124 = maxps(auVar168,auVar35);
          auVar169._0_4_ = -(uint)(auVar124._0_4_ < 1.844e+18 && -1.844e+18 < auVar175._0_4_);
          auVar169._4_4_ = -(uint)(auVar124._4_4_ < 1.844e+18 && -1.844e+18 < auVar175._4_4_);
          auVar169._8_4_ = -(uint)(auVar124._8_4_ < 1.844e+18 && -1.844e+18 < auVar175._8_4_);
          auVar169._12_4_ = -(uint)(auVar124._12_4_ < 1.844e+18 && -1.844e+18 < auVar175._12_4_);
          uVar14 = movmskps((int)(sVar9 * uVar23),auVar169);
          if ((~(byte)uVar14 & 7) != 0) goto LAB_00996008;
          bVar24 = uVar19 != (this->super_CurveGeometryInterface<embree::BezierCurveT>).
                             super_CurveGeometry.super_Geometry.numTimeSteps - 1;
          uVar19 = uVar19 + 1;
        } while (bVar24);
        pcVar8 = (pBVar6->super_RawBufferView).ptr_ofs;
        sVar9 = (pBVar6->super_RawBufferView).stride;
        pfVar1 = (float *)(pcVar8 + sVar9 * uVar17);
        fVar55 = *pfVar1;
        fVar74 = pfVar1[1];
        fVar76 = pfVar1[2];
        pfVar2 = (float *)(pcVar8 + sVar9 * uVar22);
        pfVar3 = (float *)(pcVar8 + sVar9 * uVar23);
        pfVar4 = (float *)(pcVar8 + sVar9 * uVar21);
        fVar78 = *pfVar4;
        fVar25 = pfVar4[1];
        fVar52 = pfVar4[2];
        fVar81 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
                 maxRadiusScale;
        fVar99 = pfVar1[3] * fVar81;
        fVar110 = pfVar4[3] * fVar81;
        pBVar7 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
                 normals.items;
        pcVar8 = (pBVar7->super_RawBufferView).ptr_ofs;
        sVar9 = (pBVar7->super_RawBufferView).stride;
        pfVar1 = (float *)(pcVar8 + uVar17 * sVar9);
        fVar53 = *pfVar1;
        fVar54 = pfVar1[1];
        fVar112 = pfVar1[2];
        pfVar1 = (float *)(pcVar8 + uVar22 * sVar9);
        pfVar4 = (float *)(pcVar8 + uVar23 * sVar9);
        pfVar5 = (float *)(pcVar8 + sVar9 * uVar21);
        fVar121 = *pfVar5;
        fVar122 = pfVar5[1];
        fVar123 = pfVar5[2];
        fVar154 = *pfVar3 * 0.0;
        fVar155 = pfVar3[1] * 0.0;
        fVar160 = pfVar3[2] * 0.0;
        fVar161 = pfVar3[3] * fVar81 * 0.0;
        fVar185 = fVar78 * 0.0 + fVar154;
        fVar178 = fVar25 * 0.0 + fVar155;
        fVar183 = fVar52 * 0.0 + fVar160;
        fVar184 = fVar110 * 0.0 + fVar161;
        fVar150 = *pfVar2 * 0.0;
        fVar142 = pfVar2[1] * 0.0;
        fVar148 = pfVar2[2] * 0.0;
        fVar152 = pfVar2[3] * fVar81 * 0.0;
        fVar98 = fVar150 + fVar185 + fVar55;
        fVar143 = fVar142 + fVar178 + fVar74;
        fVar144 = fVar148 + fVar183 + fVar76;
        fVar162 = fVar152 + fVar184 + fVar99;
        fVar185 = (*pfVar2 * 3.0 + fVar185) - fVar55 * 3.0;
        fVar178 = (pfVar2[1] * 3.0 + fVar178) - fVar74 * 3.0;
        fVar183 = (pfVar2[2] * 3.0 + fVar183) - fVar76 * 3.0;
        fVar184 = (pfVar2[3] * fVar81 * 3.0 + fVar184) - fVar99 * 3.0;
        fVar205 = *pfVar4 * 0.0;
        fVar141 = pfVar4[1] * 0.0;
        fVar146 = pfVar4[2] * 0.0;
        fVar111 = fVar121 * 0.0 + fVar205;
        fVar80 = fVar122 * 0.0 + fVar141;
        fVar97 = fVar123 * 0.0 + fVar146;
        fVar153 = *pfVar1 * 0.0;
        fVar147 = pfVar1[1] * 0.0;
        fVar151 = pfVar1[2] * 0.0;
        fVar149 = fVar153 + fVar111 + fVar53;
        fVar197 = fVar147 + fVar80 + fVar54;
        fVar203 = fVar151 + fVar97 + fVar112;
        fVar111 = (*pfVar1 * 3.0 + fVar111) - fVar53 * 3.0;
        fVar80 = (pfVar1[1] * 3.0 + fVar80) - fVar54 * 3.0;
        fVar97 = (pfVar1[2] * 3.0 + fVar97) - fVar112 * 3.0;
        fVar154 = fVar154 + fVar78 + fVar150 + fVar55 * 0.0;
        fVar155 = fVar155 + fVar25 + fVar142 + fVar74 * 0.0;
        fVar160 = fVar160 + fVar52 + fVar148 + fVar76 * 0.0;
        fVar161 = fVar161 + fVar110 + fVar152 + fVar99 * 0.0;
        fVar150 = ((fVar78 * 3.0 - *pfVar3 * 3.0) + fVar150) - fVar55 * 0.0;
        fVar142 = ((fVar25 * 3.0 - pfVar3[1] * 3.0) + fVar142) - fVar74 * 0.0;
        fVar148 = ((fVar52 * 3.0 - pfVar3[2] * 3.0) + fVar148) - fVar76 * 0.0;
        fVar152 = ((fVar110 * 3.0 - pfVar3[3] * fVar81 * 3.0) + fVar152) - fVar99 * 0.0;
        fVar76 = fVar205 + fVar121 + fVar153 + fVar53 * 0.0;
        fVar78 = fVar141 + fVar122 + fVar147 + fVar54 * 0.0;
        fVar25 = fVar146 + fVar123 + fVar151 + fVar112 * 0.0;
        fVar81 = ((fVar121 * 3.0 - *pfVar4 * 3.0) + fVar153) - fVar53 * 0.0;
        fVar55 = ((fVar122 * 3.0 - pfVar4[1] * 3.0) + fVar147) - fVar54 * 0.0;
        fVar74 = ((fVar123 * 3.0 - pfVar4[2] * 3.0) + fVar151) - fVar112 * 0.0;
        fVar205 = fVar178 * fVar149 - fVar197 * fVar185;
        fVar197 = fVar183 * fVar197 - fVar203 * fVar178;
        fVar203 = fVar185 * fVar203 - fVar149 * fVar183;
        fVar110 = fVar178 * fVar111 - fVar80 * fVar185;
        fVar80 = fVar183 * fVar80 - fVar97 * fVar178;
        fVar111 = fVar185 * fVar97 - fVar111 * fVar183;
        fVar53 = fVar142 * fVar76 - fVar78 * fVar150;
        fVar121 = fVar148 * fVar78 - fVar25 * fVar142;
        fVar123 = fVar150 * fVar25 - fVar76 * fVar148;
        fVar76 = fVar142 * fVar81 - fVar55 * fVar150;
        fVar25 = fVar148 * fVar55 - fVar74 * fVar142;
        fVar52 = fVar150 * fVar74 - fVar81 * fVar148;
        fVar55 = fVar203 * fVar203 + fVar197 * fVar197 + fVar205 * fVar205;
        auVar156 = ZEXT416((uint)fVar55);
        auVar124 = rsqrtss(ZEXT416((uint)fVar55),auVar156);
        fVar81 = auVar124._0_4_;
        fVar74 = fVar81 * 1.5 - fVar81 * fVar81 * fVar55 * 0.5 * fVar81;
        fVar141 = fVar205 * fVar110 + fVar203 * fVar111 + fVar197 * fVar80;
        auVar124 = rcpss(auVar156,auVar156);
        fVar81 = (2.0 - fVar55 * auVar124._0_4_) * auVar124._0_4_;
        fVar97 = fVar123 * fVar123 + fVar121 * fVar121 + fVar53 * fVar53;
        auVar124 = ZEXT416((uint)fVar97);
        auVar156 = rsqrtss(ZEXT416((uint)fVar97),auVar124);
        fVar78 = auVar156._0_4_;
        fVar54 = fVar78 * 1.5 - fVar78 * fVar78 * fVar97 * 0.5 * fVar78;
        fVar149 = fVar53 * fVar76 + fVar123 * fVar52 + fVar121 * fVar25;
        auVar124 = rcpss(auVar124,auVar124);
        fVar78 = (2.0 - fVar97 * auVar124._0_4_) * auVar124._0_4_;
        fVar112 = fVar162 * fVar197 * fVar74;
        fVar122 = fVar162 * fVar203 * fVar74;
        fVar99 = fVar162 * fVar205 * fVar74;
        fVar146 = fVar98 - fVar112;
        fVar153 = fVar143 - fVar122;
        fVar147 = fVar144 - fVar99;
        fVar80 = fVar162 * fVar81 * (fVar55 * fVar80 - fVar141 * fVar197) * fVar74 +
                 fVar184 * fVar197 * fVar74;
        fVar111 = fVar162 * fVar81 * (fVar55 * fVar111 - fVar141 * fVar203) * fVar74 +
                  fVar184 * fVar203 * fVar74;
        fVar110 = fVar162 * fVar81 * (fVar55 * fVar110 - fVar141 * fVar205) * fVar74 +
                  fVar184 * fVar205 * fVar74;
        fVar81 = fVar161 * fVar121 * fVar54;
        fVar55 = fVar161 * fVar123 * fVar54;
        fVar74 = fVar161 * fVar53 * fVar54;
        fVar197 = fVar154 - fVar81;
        fVar203 = fVar155 - fVar55;
        fVar205 = fVar160 - fVar74;
        fVar25 = fVar161 * fVar78 * (fVar97 * fVar25 - fVar149 * fVar121) * fVar54 +
                 fVar152 * fVar121 * fVar54;
        fVar52 = fVar161 * fVar78 * (fVar97 * fVar52 - fVar149 * fVar123) * fVar54 +
                 fVar152 * fVar123 * fVar54;
        fVar76 = fVar161 * fVar78 * (fVar97 * fVar76 - fVar149 * fVar53) * fVar54 +
                 fVar152 * fVar53 * fVar54;
        fVar121 = (fVar185 - fVar80) * 0.33333334 + fVar146;
        fVar123 = (fVar178 - fVar111) * 0.33333334 + fVar153;
        fVar184 = (fVar183 - fVar110) * 0.33333334 + fVar147;
        fVar78 = fVar197 - (fVar150 - fVar25) * 0.33333334;
        fVar53 = fVar203 - (fVar142 - fVar52) * 0.33333334;
        fVar54 = fVar205 - (fVar148 - fVar76) * 0.33333334;
        lVar13 = 0;
        local_228 = _DAT_01f7aa00;
        auVar124 = _DAT_01f7a9f0;
        auVar156 = _DAT_01f7a9f0;
        auVar165 = _DAT_01f7aa00;
        auVar175 = _DAT_01f7a9f0;
        auVar179 = _DAT_01f7aa00;
        bVar24 = true;
        do {
          bVar16 = bVar24;
          iVar18 = (int)lVar13;
          lVar15 = lVar13 * 4;
          fVar97 = *(float *)(bezier_basis0 + lVar15 + 0x1dc);
          fVar149 = *(float *)(bezier_basis0 + lVar15 + 0x1e0);
          fVar141 = *(float *)(bezier_basis0 + lVar15 + 0x1e4);
          fVar151 = *(float *)(bezier_basis0 + lVar15 + 0x1e8);
          lVar15 = lVar13 * 4;
          fVar152 = *(float *)(bezier_basis0 + lVar15 + 0x660);
          fVar161 = *(float *)(bezier_basis0 + lVar15 + 0x664);
          fVar162 = *(float *)(bezier_basis0 + lVar15 + 0x668);
          fVar163 = *(float *)(bezier_basis0 + lVar15 + 0x66c);
          lVar15 = lVar13 * 4;
          fVar164 = *(float *)(bezier_basis0 + lVar15 + 0xae4);
          fVar191 = *(float *)(bezier_basis0 + lVar15 + 0xae8);
          fVar193 = *(float *)(bezier_basis0 + lVar15 + 0xaec);
          fVar195 = *(float *)(bezier_basis0 + lVar15 + 0xaf0);
          lVar15 = lVar13 * 4;
          fVar207 = *(float *)(bezier_basis0 + lVar15 + 0xf68);
          fVar10 = *(float *)(bezier_basis0 + lVar15 + 0xf6c);
          fVar11 = *(float *)(bezier_basis0 + lVar15 + 0xf70);
          fVar12 = *(float *)(bezier_basis0 + lVar15 + 0xf74);
          auVar158._0_4_ =
               fVar146 * fVar97 + fVar121 * fVar152 + fVar78 * fVar164 + fVar197 * fVar207;
          auVar158._4_4_ =
               fVar146 * fVar149 + fVar121 * fVar161 + fVar78 * fVar191 + fVar197 * fVar10;
          auVar158._8_4_ =
               fVar146 * fVar141 + fVar121 * fVar162 + fVar78 * fVar193 + fVar197 * fVar11;
          auVar158._12_4_ =
               fVar146 * fVar151 + fVar121 * fVar163 + fVar78 * fVar195 + fVar197 * fVar12;
          auVar201._0_4_ =
               fVar153 * fVar97 + fVar123 * fVar152 + fVar53 * fVar164 + fVar203 * fVar207;
          auVar201._4_4_ =
               fVar153 * fVar149 + fVar123 * fVar161 + fVar53 * fVar191 + fVar203 * fVar10;
          auVar201._8_4_ =
               fVar153 * fVar141 + fVar123 * fVar162 + fVar53 * fVar193 + fVar203 * fVar11;
          auVar201._12_4_ =
               fVar153 * fVar151 + fVar123 * fVar163 + fVar53 * fVar195 + fVar203 * fVar12;
          auVar180._0_4_ =
               fVar97 * fVar147 + fVar152 * fVar184 + fVar164 * fVar54 + fVar207 * fVar205;
          auVar180._4_4_ =
               fVar149 * fVar147 + fVar161 * fVar184 + fVar191 * fVar54 + fVar10 * fVar205;
          auVar180._8_4_ =
               fVar141 * fVar147 + fVar162 * fVar184 + fVar193 * fVar54 + fVar11 * fVar205;
          auVar180._12_4_ =
               fVar151 * fVar147 + fVar163 * fVar184 + fVar195 * fVar54 + fVar12 * fVar205;
          lVar15 = lVar13 * 4;
          fVar97 = *(float *)(bezier_basis0 + lVar15 + 0x13ec);
          fVar149 = *(float *)(bezier_basis0 + lVar15 + 0x13f0);
          fVar141 = *(float *)(bezier_basis0 + lVar15 + 0x13f4);
          fVar151 = *(float *)(bezier_basis0 + lVar15 + 0x13f8);
          lVar15 = lVar13 * 4;
          fVar152 = *(float *)(bezier_basis0 + lVar15 + 0x1cf4);
          fVar161 = *(float *)(bezier_basis0 + lVar15 + 0x1cf8);
          fVar162 = *(float *)(bezier_basis0 + lVar15 + 0x1cfc);
          fVar163 = *(float *)(bezier_basis0 + lVar15 + 0x1d00);
          lVar15 = lVar13 * 4;
          fVar164 = *(float *)(bezier_basis0 + lVar15 + 0x2178);
          fVar191 = *(float *)(bezier_basis0 + lVar15 + 0x217c);
          fVar193 = *(float *)(bezier_basis0 + lVar15 + 0x2180);
          fVar195 = *(float *)(bezier_basis0 + lVar15 + 0x2184);
          lVar13 = lVar13 * 4;
          fVar207 = *(float *)(bezier_basis0 + lVar13 + 0x1870);
          fVar10 = *(float *)(bezier_basis0 + lVar13 + 0x1874);
          fVar11 = *(float *)(bezier_basis0 + lVar13 + 0x1878);
          fVar12 = *(float *)(bezier_basis0 + lVar13 + 0x187c);
          fVar79 = fVar146 * fVar97 + fVar121 * fVar207 + fVar78 * fVar152 + fVar197 * fVar164;
          fVar198 = fVar146 * fVar149 + fVar121 * fVar10 + fVar78 * fVar161 + fVar197 * fVar191;
          fVar204 = fVar146 * fVar141 + fVar121 * fVar11 + fVar78 * fVar162 + fVar197 * fVar193;
          fVar206 = fVar146 * fVar151 + fVar121 * fVar12 + fVar78 * fVar163 + fVar197 * fVar195;
          fVar57 = fVar153 * fVar97 + fVar123 * fVar207 + fVar53 * fVar152 + fVar203 * fVar164;
          fVar56 = fVar153 * fVar149 + fVar123 * fVar10 + fVar53 * fVar161 + fVar203 * fVar191;
          fVar75 = fVar153 * fVar141 + fVar123 * fVar11 + fVar53 * fVar162 + fVar203 * fVar193;
          fVar77 = fVar153 * fVar151 + fVar123 * fVar12 + fVar53 * fVar163 + fVar203 * fVar195;
          fVar97 = fVar97 * fVar147 + fVar207 * fVar184 + fVar152 * fVar54 + fVar164 * fVar205;
          fVar149 = fVar149 * fVar147 + fVar10 * fVar184 + fVar161 * fVar54 + fVar191 * fVar205;
          fVar141 = fVar141 * fVar147 + fVar11 * fVar184 + fVar162 * fVar54 + fVar193 * fVar205;
          fVar151 = fVar151 * fVar147 + fVar12 * fVar184 + fVar163 * fVar54 + fVar195 * fVar205;
          uVar189 = -(uint)(iVar18 == 0);
          uVar192 = -(uint)(iVar18 == 1);
          uVar194 = -(uint)(iVar18 == 2);
          uVar196 = -(uint)(iVar18 == 3);
          uVar171 = -(uint)(iVar18 == 7);
          uVar172 = -(uint)(iVar18 == 6);
          uVar173 = -(uint)(iVar18 == 5);
          uVar174 = -(uint)(iVar18 == 4);
          auVar115._0_4_ = (float)(~uVar171 & (uint)fVar79) * 0.055555556 + auVar158._0_4_;
          auVar115._4_4_ = (float)(~uVar172 & (uint)fVar198) * 0.055555556 + auVar158._4_4_;
          auVar115._8_4_ = (float)(~uVar173 & (uint)fVar204) * 0.055555556 + auVar158._8_4_;
          auVar115._12_4_ = (float)(~uVar174 & (uint)fVar206) * 0.055555556 + auVar158._12_4_;
          auVar175 = minps(auVar175,auVar158);
          auVar113 = maxps(auVar179,auVar158);
          auVar159._0_8_ =
               CONCAT44(auVar158._4_4_ - (float)(~uVar192 & (uint)fVar198) * 0.055555556,
                        auVar158._0_4_ - (float)(~uVar189 & (uint)fVar79) * 0.055555556);
          auVar159._8_4_ = auVar158._8_4_ - (float)(~uVar194 & (uint)fVar204) * 0.055555556;
          auVar159._12_4_ = auVar158._12_4_ - (float)(~uVar196 & (uint)fVar206) * 0.055555556;
          auVar104._0_4_ = (float)(~uVar171 & (uint)fVar57) * 0.055555556 + auVar201._0_4_;
          auVar104._4_4_ = (float)(~uVar172 & (uint)fVar56) * 0.055555556 + auVar201._4_4_;
          auVar104._8_4_ = (float)(~uVar173 & (uint)fVar75) * 0.055555556 + auVar201._8_4_;
          auVar104._12_4_ = (float)(~uVar174 & (uint)fVar77) * 0.055555556 + auVar201._12_4_;
          auVar156 = minps(auVar156,auVar201);
          auVar186 = maxps(local_228,auVar201);
          auVar202._0_8_ =
               CONCAT44(auVar201._4_4_ - (float)(~uVar192 & (uint)fVar56) * 0.055555556,
                        auVar201._0_4_ - (float)(~uVar189 & (uint)fVar57) * 0.055555556);
          auVar202._8_4_ = auVar201._8_4_ - (float)(~uVar194 & (uint)fVar75) * 0.055555556;
          auVar202._12_4_ = auVar201._12_4_ - (float)(~uVar196 & (uint)fVar77) * 0.055555556;
          auVar170._0_4_ = (float)(~uVar171 & (uint)fVar97) * 0.055555556 + auVar180._0_4_;
          auVar170._4_4_ = (float)(~uVar172 & (uint)fVar149) * 0.055555556 + auVar180._4_4_;
          auVar170._8_4_ = (float)(~uVar173 & (uint)fVar141) * 0.055555556 + auVar180._8_4_;
          auVar170._12_4_ = (float)(~uVar174 & (uint)fVar151) * 0.055555556 + auVar180._12_4_;
          auVar179 = minps(auVar124,auVar180);
          auVar165 = maxps(auVar165,auVar180);
          auVar181._0_8_ =
               CONCAT44(auVar180._4_4_ - (float)(~uVar192 & (uint)fVar149) * 0.055555556,
                        auVar180._0_4_ - (float)(~uVar189 & (uint)fVar97) * 0.055555556);
          auVar181._8_4_ = auVar180._8_4_ - (float)(~uVar194 & (uint)fVar141) * 0.055555556;
          auVar181._12_4_ = auVar180._12_4_ - (float)(~uVar196 & (uint)fVar151) * 0.055555556;
          auVar36._8_4_ = auVar159._8_4_;
          auVar36._0_8_ = auVar159._0_8_;
          auVar36._12_4_ = auVar159._12_4_;
          auVar124 = minps(auVar36,auVar115);
          auVar175 = minps(auVar175,auVar124);
          auVar37._8_4_ = auVar202._8_4_;
          auVar37._0_8_ = auVar202._0_8_;
          auVar37._12_4_ = auVar202._12_4_;
          auVar124 = minps(auVar37,auVar104);
          auVar156 = minps(auVar156,auVar124);
          auVar38._8_4_ = auVar181._8_4_;
          auVar38._0_8_ = auVar181._0_8_;
          auVar38._12_4_ = auVar181._12_4_;
          auVar124 = minps(auVar38,auVar170);
          auVar124 = minps(auVar179,auVar124);
          auVar179 = maxps(auVar159,auVar115);
          auVar179 = maxps(auVar113,auVar179);
          auVar113 = maxps(auVar202,auVar104);
          local_228 = maxps(auVar186,auVar113);
          auVar186 = maxps(auVar181,auVar170);
          auVar165 = maxps(auVar165,auVar186);
          lVar13 = 4;
          bVar24 = false;
        } while (bVar16);
        fVar98 = fVar98 + fVar112;
        fVar143 = fVar143 + fVar122;
        fVar144 = fVar144 + fVar99;
        fVar154 = fVar154 + fVar81;
        fVar155 = fVar155 + fVar55;
        fVar160 = fVar160 + fVar74;
        fVar78 = (fVar80 + fVar185) * 0.33333334 + fVar98;
        fVar53 = (fVar111 + fVar178) * 0.33333334 + fVar143;
        fVar54 = (fVar110 + fVar183) * 0.33333334 + fVar144;
        fVar81 = fVar154 - (fVar25 + fVar150) * 0.33333334;
        fVar55 = fVar155 - (fVar52 + fVar142) * 0.33333334;
        fVar74 = fVar160 - (fVar76 + fVar148) * 0.33333334;
        auVar39._4_4_ = auVar175._0_4_;
        auVar39._0_4_ = auVar175._4_4_;
        auVar39._8_4_ = auVar175._12_4_;
        auVar39._12_4_ = auVar175._8_4_;
        auVar175 = minps(auVar39,auVar175);
        auVar66._0_8_ = auVar175._8_8_;
        auVar66._8_4_ = auVar175._0_4_;
        auVar66._12_4_ = auVar175._4_4_;
        auVar175 = minps(auVar66,auVar175);
        auVar40._4_4_ = auVar156._0_4_;
        auVar40._0_4_ = auVar156._4_4_;
        auVar40._8_4_ = auVar156._12_4_;
        auVar40._12_4_ = auVar156._8_4_;
        auVar156 = minps(auVar40,auVar156);
        auVar105._0_8_ = auVar156._8_8_;
        auVar105._8_4_ = auVar156._0_4_;
        auVar105._12_4_ = auVar156._4_4_;
        auVar156 = minps(auVar105,auVar156);
        auVar41._4_4_ = auVar124._0_4_;
        auVar41._0_4_ = auVar124._4_4_;
        auVar41._8_4_ = auVar124._12_4_;
        auVar41._12_4_ = auVar124._8_4_;
        auVar186 = minps(auVar41,auVar124);
        auVar42._0_8_ = auVar186._8_8_;
        auVar42._8_4_ = auVar186._0_4_;
        auVar42._12_4_ = auVar186._4_4_;
        auVar133._4_4_ = auVar156._0_4_;
        auVar133._0_4_ = auVar175._0_4_;
        auVar43._4_4_ = auVar179._0_4_;
        auVar43._0_4_ = auVar179._4_4_;
        auVar43._8_4_ = auVar179._12_4_;
        auVar43._12_4_ = auVar179._8_4_;
        auVar124 = maxps(auVar43,auVar179);
        auVar67._0_8_ = auVar124._8_8_;
        auVar67._8_4_ = auVar124._0_4_;
        auVar67._12_4_ = auVar124._4_4_;
        auVar156 = maxps(auVar67,auVar124);
        auVar44._4_4_ = local_228._0_4_;
        auVar44._0_4_ = local_228._4_4_;
        auVar44._8_4_ = local_228._12_4_;
        auVar44._12_4_ = local_228._8_4_;
        auVar124 = maxps(auVar44,local_228);
        auVar92._0_8_ = auVar124._8_8_;
        auVar92._8_4_ = auVar124._0_4_;
        auVar92._12_4_ = auVar124._4_4_;
        auVar124 = maxps(auVar92,auVar124);
        auVar45._4_4_ = auVar165._0_4_;
        auVar45._0_4_ = auVar165._4_4_;
        auVar45._8_4_ = auVar165._12_4_;
        auVar45._12_4_ = auVar165._8_4_;
        auVar113 = maxps(auVar45,auVar165);
        auVar46._0_8_ = auVar113._8_8_;
        auVar46._8_4_ = auVar113._0_4_;
        auVar46._12_4_ = auVar113._4_4_;
        auVar140._4_4_ = auVar124._0_4_;
        auVar140._0_4_ = auVar156._0_4_;
        lVar13 = 0;
        local_228 = _DAT_01f7aa00;
        auVar124 = _DAT_01f7a9f0;
        auVar156 = _DAT_01f7a9f0;
        auVar165 = _DAT_01f7aa00;
        auVar175 = _DAT_01f7a9f0;
        auVar179 = _DAT_01f7aa00;
        bVar24 = true;
        do {
          bVar16 = bVar24;
          iVar18 = (int)lVar13;
          lVar15 = lVar13 * 4;
          fVar76 = *(float *)(bezier_basis0 + lVar15 + 0x1dc);
          fVar25 = *(float *)(bezier_basis0 + lVar15 + 0x1e0);
          fVar52 = *(float *)(bezier_basis0 + lVar15 + 0x1e4);
          fVar112 = *(float *)(bezier_basis0 + lVar15 + 0x1e8);
          lVar15 = lVar13 * 4;
          fVar121 = *(float *)(bezier_basis0 + lVar15 + 0x660);
          fVar122 = *(float *)(bezier_basis0 + lVar15 + 0x664);
          fVar123 = *(float *)(bezier_basis0 + lVar15 + 0x668);
          fVar185 = *(float *)(bezier_basis0 + lVar15 + 0x66c);
          lVar15 = lVar13 * 4;
          fVar178 = *(float *)(bezier_basis0 + lVar15 + 0xae4);
          fVar183 = *(float *)(bezier_basis0 + lVar15 + 0xae8);
          fVar184 = *(float *)(bezier_basis0 + lVar15 + 0xaec);
          fVar99 = *(float *)(bezier_basis0 + lVar15 + 0xaf0);
          lVar15 = lVar13 * 4;
          fVar110 = *(float *)(bezier_basis0 + lVar15 + 0xf68);
          fVar111 = *(float *)(bezier_basis0 + lVar15 + 0xf6c);
          fVar80 = *(float *)(bezier_basis0 + lVar15 + 0xf70);
          fVar97 = *(float *)(bezier_basis0 + lVar15 + 0xf74);
          auVar187._0_4_ = fVar98 * fVar76 + fVar78 * fVar121 + fVar81 * fVar178 + fVar154 * fVar110
          ;
          auVar187._4_4_ = fVar98 * fVar25 + fVar78 * fVar122 + fVar81 * fVar183 + fVar154 * fVar111
          ;
          auVar187._8_4_ = fVar98 * fVar52 + fVar78 * fVar123 + fVar81 * fVar184 + fVar154 * fVar80;
          auVar187._12_4_ = fVar98 * fVar112 + fVar78 * fVar185 + fVar81 * fVar99 + fVar154 * fVar97
          ;
          auVar106._0_4_ =
               fVar143 * fVar76 + fVar53 * fVar121 + fVar55 * fVar178 + fVar155 * fVar110;
          auVar106._4_4_ =
               fVar143 * fVar25 + fVar53 * fVar122 + fVar55 * fVar183 + fVar155 * fVar111;
          auVar106._8_4_ = fVar143 * fVar52 + fVar53 * fVar123 + fVar55 * fVar184 + fVar155 * fVar80
          ;
          auVar106._12_4_ =
               fVar143 * fVar112 + fVar53 * fVar185 + fVar55 * fVar99 + fVar155 * fVar97;
          auVar131._0_4_ =
               fVar76 * fVar144 + fVar121 * fVar54 + fVar178 * fVar74 + fVar110 * fVar160;
          auVar131._4_4_ =
               fVar25 * fVar144 + fVar122 * fVar54 + fVar183 * fVar74 + fVar111 * fVar160;
          auVar131._8_4_ = fVar52 * fVar144 + fVar123 * fVar54 + fVar184 * fVar74 + fVar80 * fVar160
          ;
          auVar131._12_4_ =
               fVar112 * fVar144 + fVar185 * fVar54 + fVar99 * fVar74 + fVar97 * fVar160;
          lVar15 = lVar13 * 4;
          fVar76 = *(float *)(bezier_basis0 + lVar15 + 0x13ec);
          fVar25 = *(float *)(bezier_basis0 + lVar15 + 0x13f0);
          fVar52 = *(float *)(bezier_basis0 + lVar15 + 0x13f4);
          fVar112 = *(float *)(bezier_basis0 + lVar15 + 0x13f8);
          lVar15 = lVar13 * 4;
          fVar121 = *(float *)(bezier_basis0 + lVar15 + 0x1cf4);
          fVar122 = *(float *)(bezier_basis0 + lVar15 + 0x1cf8);
          fVar123 = *(float *)(bezier_basis0 + lVar15 + 0x1cfc);
          fVar185 = *(float *)(bezier_basis0 + lVar15 + 0x1d00);
          lVar15 = lVar13 * 4;
          fVar178 = *(float *)(bezier_basis0 + lVar15 + 0x2178);
          fVar183 = *(float *)(bezier_basis0 + lVar15 + 0x217c);
          fVar184 = *(float *)(bezier_basis0 + lVar15 + 0x2180);
          fVar99 = *(float *)(bezier_basis0 + lVar15 + 0x2184);
          lVar13 = lVar13 * 4;
          fVar110 = *(float *)(bezier_basis0 + lVar13 + 0x1870);
          fVar111 = *(float *)(bezier_basis0 + lVar13 + 0x1874);
          fVar80 = *(float *)(bezier_basis0 + lVar13 + 0x1878);
          fVar97 = *(float *)(bezier_basis0 + lVar13 + 0x187c);
          fVar141 = fVar98 * fVar76 + fVar78 * fVar110 + fVar81 * fVar121 + fVar154 * fVar178;
          fVar146 = fVar98 * fVar25 + fVar78 * fVar111 + fVar81 * fVar122 + fVar154 * fVar183;
          fVar150 = fVar98 * fVar52 + fVar78 * fVar80 + fVar81 * fVar123 + fVar154 * fVar184;
          fVar153 = fVar98 * fVar112 + fVar78 * fVar97 + fVar81 * fVar185 + fVar154 * fVar99;
          fVar149 = fVar143 * fVar76 + fVar53 * fVar110 + fVar55 * fVar121 + fVar155 * fVar178;
          fVar197 = fVar143 * fVar25 + fVar53 * fVar111 + fVar55 * fVar122 + fVar155 * fVar183;
          fVar203 = fVar143 * fVar52 + fVar53 * fVar80 + fVar55 * fVar123 + fVar155 * fVar184;
          fVar205 = fVar143 * fVar112 + fVar53 * fVar97 + fVar55 * fVar185 + fVar155 * fVar99;
          fVar76 = fVar76 * fVar144 + fVar110 * fVar54 + fVar121 * fVar74 + fVar178 * fVar160;
          fVar25 = fVar25 * fVar144 + fVar111 * fVar54 + fVar122 * fVar74 + fVar183 * fVar160;
          fVar52 = fVar52 * fVar144 + fVar80 * fVar54 + fVar123 * fVar74 + fVar184 * fVar160;
          fVar112 = fVar112 * fVar144 + fVar97 * fVar54 + fVar185 * fVar74 + fVar99 * fVar160;
          uVar171 = -(uint)(iVar18 == 0);
          uVar172 = -(uint)(iVar18 == 1);
          uVar173 = -(uint)(iVar18 == 2);
          uVar174 = -(uint)(iVar18 == 3);
          uVar189 = -(uint)(iVar18 == 7);
          uVar192 = -(uint)(iVar18 == 6);
          uVar194 = -(uint)(iVar18 == 5);
          uVar196 = -(uint)(iVar18 == 4);
          auVar139._0_4_ = (float)(~uVar189 & (uint)fVar141) * 0.055555556 + auVar187._0_4_;
          auVar139._4_4_ = (float)(~uVar192 & (uint)fVar146) * 0.055555556 + auVar187._4_4_;
          auVar139._8_4_ = (float)(~uVar194 & (uint)fVar150) * 0.055555556 + auVar187._8_4_;
          auVar139._12_4_ = (float)(~uVar196 & (uint)fVar153) * 0.055555556 + auVar187._12_4_;
          auVar156 = minps(auVar156,auVar187);
          auVar179 = maxps(auVar179,auVar187);
          auVar188._0_8_ =
               CONCAT44(auVar187._4_4_ - (float)(~uVar172 & (uint)fVar146) * 0.055555556,
                        auVar187._0_4_ - (float)(~uVar171 & (uint)fVar141) * 0.055555556);
          auVar188._8_4_ = auVar187._8_4_ - (float)(~uVar173 & (uint)fVar150) * 0.055555556;
          auVar188._12_4_ = auVar187._12_4_ - (float)(~uVar174 & (uint)fVar153) * 0.055555556;
          auVar177._0_4_ = (float)(~uVar189 & (uint)fVar149) * 0.055555556 + auVar106._0_4_;
          auVar177._4_4_ = (float)(~uVar192 & (uint)fVar197) * 0.055555556 + auVar106._4_4_;
          auVar177._8_4_ = (float)(~uVar194 & (uint)fVar203) * 0.055555556 + auVar106._8_4_;
          auVar177._12_4_ = (float)(~uVar196 & (uint)fVar205) * 0.055555556 + auVar106._12_4_;
          auVar175 = minps(auVar175,auVar106);
          auVar102 = maxps(local_228,auVar106);
          auVar107._0_8_ =
               CONCAT44(auVar106._4_4_ - (float)(~uVar172 & (uint)fVar197) * 0.055555556,
                        auVar106._0_4_ - (float)(~uVar171 & (uint)fVar149) * 0.055555556);
          auVar107._8_4_ = auVar106._8_4_ - (float)(~uVar173 & (uint)fVar203) * 0.055555556;
          auVar107._12_4_ = auVar106._12_4_ - (float)(~uVar174 & (uint)fVar205) * 0.055555556;
          auVar182._0_4_ = (float)(~uVar189 & (uint)fVar76) * 0.055555556 + auVar131._0_4_;
          auVar182._4_4_ = (float)(~uVar192 & (uint)fVar25) * 0.055555556 + auVar131._4_4_;
          auVar182._8_4_ = (float)(~uVar194 & (uint)fVar52) * 0.055555556 + auVar131._8_4_;
          auVar182._12_4_ = (float)(~uVar196 & (uint)fVar112) * 0.055555556 + auVar131._12_4_;
          auVar124 = minps(auVar124,auVar131);
          auVar114 = maxps(auVar165,auVar131);
          auVar132._0_8_ =
               CONCAT44(auVar131._4_4_ - (float)(~uVar172 & (uint)fVar25) * 0.055555556,
                        auVar131._0_4_ - (float)(~uVar171 & (uint)fVar76) * 0.055555556);
          auVar132._8_4_ = auVar131._8_4_ - (float)(~uVar173 & (uint)fVar52) * 0.055555556;
          auVar132._12_4_ = auVar131._12_4_ - (float)(~uVar174 & (uint)fVar112) * 0.055555556;
          auVar116._8_4_ = auVar188._8_4_;
          auVar116._0_8_ = auVar188._0_8_;
          auVar116._12_4_ = auVar188._12_4_;
          auVar165 = minps(auVar116,auVar139);
          auVar156 = minps(auVar156,auVar165);
          auVar117._8_4_ = auVar107._8_4_;
          auVar117._0_8_ = auVar107._0_8_;
          auVar117._12_4_ = auVar107._12_4_;
          auVar165 = minps(auVar117,auVar177);
          auVar175 = minps(auVar175,auVar165);
          auVar118._8_4_ = auVar132._8_4_;
          auVar118._0_8_ = auVar132._0_8_;
          auVar118._12_4_ = auVar132._12_4_;
          auVar165 = minps(auVar118,auVar182);
          auVar124 = minps(auVar124,auVar165);
          auVar165 = maxps(auVar188,auVar139);
          auVar179 = maxps(auVar179,auVar165);
          auVar165 = maxps(auVar107,auVar177);
          local_228 = maxps(auVar102,auVar165);
          auVar165 = maxps(auVar132,auVar182);
          auVar165 = maxps(auVar114,auVar165);
          lVar13 = 4;
          bVar24 = false;
        } while (bVar16);
        auVar186 = minps(auVar42,auVar186);
        auVar133._8_4_ = auVar186._0_4_;
        auVar133._12_4_ = 0;
        auVar186 = maxps(auVar46,auVar113);
        auVar140._8_4_ = auVar186._0_4_;
        auVar140._12_4_ = 0;
        auVar108._4_4_ = auVar156._0_4_;
        auVar108._0_4_ = auVar156._4_4_;
        auVar108._8_4_ = auVar156._12_4_;
        auVar108._12_4_ = auVar156._8_4_;
        auVar156 = minps(auVar108,auVar156);
        auVar93._0_8_ = auVar156._8_8_;
        auVar93._8_4_ = auVar156._0_4_;
        auVar93._12_4_ = auVar156._4_4_;
        auVar156 = minps(auVar93,auVar156);
        auVar109._4_4_ = auVar175._0_4_;
        auVar109._0_4_ = auVar175._4_4_;
        auVar109._8_4_ = auVar175._12_4_;
        auVar109._12_4_ = auVar175._8_4_;
        auVar175 = minps(auVar109,auVar175);
        auVar119._0_8_ = auVar175._8_8_;
        auVar119._8_4_ = auVar175._0_4_;
        auVar119._12_4_ = auVar175._4_4_;
        auVar175 = minps(auVar119,auVar175);
        auVar94._4_4_ = auVar124._0_4_;
        auVar94._0_4_ = auVar124._4_4_;
        auVar94._8_4_ = auVar124._12_4_;
        auVar94._12_4_ = auVar124._8_4_;
        auVar124 = minps(auVar94,auVar124);
        auVar68._0_8_ = auVar124._8_8_;
        auVar68._8_4_ = auVar124._0_4_;
        auVar68._12_4_ = auVar124._4_4_;
        auVar124 = minps(auVar68,auVar124);
        auVar120._4_4_ = auVar175._0_4_;
        auVar120._0_4_ = auVar156._0_4_;
        auVar120._8_4_ = auVar124._0_4_;
        auVar120._12_4_ = 0;
        auVar186 = minps(auVar133,auVar120);
        auVar69._4_4_ = auVar179._0_4_;
        auVar69._0_4_ = auVar179._4_4_;
        auVar69._8_4_ = auVar179._12_4_;
        auVar69._12_4_ = auVar179._8_4_;
        auVar124 = maxps(auVar69,auVar179);
        auVar95._0_8_ = auVar124._8_8_;
        auVar95._8_4_ = auVar124._0_4_;
        auVar95._12_4_ = auVar124._4_4_;
        auVar175 = maxps(auVar95,auVar124);
        auVar70._4_4_ = local_228._0_4_;
        auVar70._0_4_ = local_228._4_4_;
        auVar70._8_4_ = local_228._12_4_;
        auVar70._12_4_ = local_228._8_4_;
        auVar124 = maxps(auVar70,local_228);
        auVar47._0_8_ = auVar124._8_8_;
        auVar47._8_4_ = auVar124._0_4_;
        auVar47._12_4_ = auVar124._4_4_;
        auVar124 = maxps(auVar47,auVar124);
        auVar71._4_4_ = auVar165._0_4_;
        auVar71._0_4_ = auVar165._4_4_;
        auVar71._8_4_ = auVar165._12_4_;
        auVar71._12_4_ = auVar165._8_4_;
        auVar156 = maxps(auVar71,auVar165);
        auVar96._0_8_ = auVar156._8_8_;
        auVar96._8_4_ = auVar156._0_4_;
        auVar96._12_4_ = auVar156._4_4_;
        auVar156 = maxps(auVar96,auVar156);
        auVar48._4_4_ = auVar124._0_4_;
        auVar48._0_4_ = auVar175._0_4_;
        auVar48._8_4_ = auVar156._0_4_;
        auVar48._12_4_ = 0;
        auVar156 = maxps(auVar140,auVar48);
        auVar49._0_8_ = auVar186._0_8_ & 0x7fffffff7fffffff;
        auVar49._8_4_ = ABS(auVar186._8_4_);
        auVar49._12_4_ = auVar186._12_4_ & 0x7fffffff;
        auVar72._0_8_ = auVar156._0_8_ & 0x7fffffff7fffffff;
        auVar72._8_4_ = ABS(auVar156._8_4_);
        auVar72._12_4_ = auVar156._12_4_ & 0x7fffffff;
        auVar124 = maxps(auVar49,auVar72);
        fVar81 = auVar124._4_4_;
        if (auVar124._4_4_ <= auVar124._0_4_) {
          fVar81 = auVar124._0_4_;
        }
        auVar50._8_8_ = auVar124._8_8_;
        auVar50._0_8_ = auVar124._8_8_;
        if (auVar124._8_4_ <= fVar81) {
          auVar50._0_4_ = fVar81;
        }
        fVar81 = auVar50._0_4_ * 4.7683716e-07;
        aVar134._0_4_ = auVar186._0_4_ - fVar81;
        aVar134._4_4_ = auVar186._4_4_ - fVar81;
        aVar134._8_4_ = auVar186._8_4_ - fVar81;
        aVar51._0_4_ = fVar81 + auVar156._0_4_;
        aVar51._4_4_ = fVar81 + auVar156._4_4_;
        aVar51._8_4_ = fVar81 + auVar156._8_4_;
        aVar134.m128[3] = (float)geomID;
        aVar51.m128[3] = (float)uVar20;
        auVar73._0_4_ = aVar134._0_4_ + aVar51._0_4_;
        auVar73._4_4_ = aVar134._4_4_ + aVar51._4_4_;
        auVar73._8_4_ = aVar134._8_4_ + aVar51._8_4_;
        auVar73._12_4_ = (float)geomID + (float)uVar20;
        local_88 = minps(local_88,auVar73);
        local_98 = maxps(local_98,auVar73);
        local_b8 = minps(local_b8,(undefined1  [16])aVar134);
        prims[local_c0].lower.field_0 = aVar134;
        local_a8 = maxps(local_a8,(undefined1  [16])aVar51);
        prims[local_c0].upper.field_0 = aVar51;
        local_d0 = local_d0 + 1;
        local_c0 = local_c0 + 1;
      }
LAB_00996008:
      uVar20 = uVar20 + 1;
    } while (uVar20 < r->_end);
  }
  else {
    local_d0 = 0;
    local_98._8_8_ = 0xff800000ff800000;
    local_98._0_8_ = 0xff800000ff800000;
    local_a8._8_8_ = 0xff800000ff800000;
    local_a8._0_8_ = 0xff800000ff800000;
    local_88._8_8_ = 0x7f8000007f800000;
    local_88._0_8_ = 0x7f8000007f800000;
    local_b8._8_8_ = 0x7f8000007f800000;
    local_b8._0_8_ = 0x7f8000007f800000;
  }
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0
       = local_b8._0_8_;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
           field_0 + 8) = local_b8._8_8_;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0
       = local_a8._0_8_;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
           field_0 + 8) = local_a8._8_8_;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = local_88._0_8_;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
           field_0 + 8) = local_88._8_8_;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = local_98._0_8_;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
           field_0 + 8) = local_98._8_8_;
  __return_storage_ptr__->end = local_d0;
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArray(PrimRef* prims, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, make_range<size_t>(0, numTimeSegments()))) continue;
          const BBox3fa box = bounds(j);
          const PrimRef prim(box,geomID,unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }